

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ParamsNode * __thiscall Parser::function_params(Parser *this)

{
  int iVar1;
  bool bVar2;
  Token *pTVar3;
  ParamsNode *local_60;
  long local_58;
  string local_50;
  
  std::make_unique<ParamsNode>();
  expect(this,'(');
  do {
    while( true ) {
      pTVar3 = next_token(this);
      if (pTVar3->kind == Eof) {
        if (local_60 != (ParamsNode *)0x0) {
          (*(local_60->super_Node)._vptr_Node[1])();
        }
        return (ParamsNode *)0x0;
      }
      if ((this->tok->kind == Punctuator) && (this->tok->i == 0x29)) {
        return local_60;
      }
      bVar2 = is_builtin_type(this);
      if (bVar2) break;
      error<char_const(&)[22]>(this,(char (*) [22])"expecting \')\' or type");
    }
    std::make_unique<ParamNode>();
    *(int *)(local_58 + 0xc) = this->tok->i;
    do {
      next_token(this);
      pTVar3 = this->tok;
      if (pTVar3->kind != Punctuator) {
        if (pTVar3->kind != Identifier) goto LAB_0010d0ad;
        LexData::id_text_abi_cxx11_(&local_50,this->lex_data,pTVar3);
        std::__cxx11::string::operator=((string *)(local_58 + 0x10),(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        next_token(this);
        if (this->tok->kind == Punctuator) {
          iVar1 = this->tok->i;
          if (iVar1 == 0x2c) goto LAB_0010d0b8;
          if (iVar1 == 0x29) {
            std::vector<ParamNode*,std::allocator<ParamNode*>>::emplace_back<ParamNode*>
                      ((vector<ParamNode*,std::allocator<ParamNode*>> *)&local_60->params,
                       (ParamNode **)&local_50);
            return local_60;
          }
        }
        error<char_const(&)[38]>(this,(char (*) [38])"expecting \',\' or \')\' after param name");
        goto LAB_0010d0b8;
      }
      iVar1 = pTVar3->i;
    } while (iVar1 == 0x2a);
    if (iVar1 == 0x29) {
      std::vector<ParamNode*,std::allocator<ParamNode*>>::emplace_back<ParamNode*>
                ((vector<ParamNode*,std::allocator<ParamNode*>> *)&local_60->params,
                 (ParamNode **)&local_50);
      return local_60;
    }
    if (iVar1 != 0x2c) {
LAB_0010d0ad:
      error<char_const(&)[51]>
                (this,(char (*) [51])"expecting \',\', \')\', or param name after param type");
    }
LAB_0010d0b8:
    std::vector<ParamNode*,std::allocator<ParamNode*>>::emplace_back<ParamNode*>
              ((vector<ParamNode*,std::allocator<ParamNode*>> *)&local_60->params,
               (ParamNode **)&local_50);
  } while( true );
}

Assistant:

ParamsNode* Parser::function_params()
{
  auto ps = std::make_unique<ParamsNode>();

  expect('(');
  while (next_token().kind != TokenKind::Eof) {
    if (is_punctuator(')')) {
      return ps.release();
    }
    else if (is_builtin_type()) {
      auto p = std::make_unique<ParamNode>();
      p->builtin_type = (Keyword)tok->i;

      next_token();

      // Pointers
      while (is_punctuator('*')) // TODO add this info to param type
        next_token();

      if (is(TokenKind::Identifier)) { // Param with name
        p->name = lex_data->id_text(*tok);

        next_token();
        if (is_punctuator(')')) {
          ps->params.push_back(p.get());
          p.release();
          return ps.release();
        }
        else if (!is_punctuator(','))
          error("expecting ',' or ')' after param name");
      }
      // Param without name
      else if (is_punctuator(')')) {
        ps->params.push_back(p.get());
        p.release();
        return ps.release();
      }
      else if (!is_punctuator(','))
        error("expecting ',', ')', or param name after param type");

      ps->params.push_back(p.get());
      p.release();
    }
    else {
      error("expecting ')' or type");
    }
  }

  return nullptr;
}